

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O1

void lace_run_task(Task *task)

{
  sem_t *__sem;
  WorkerP *self;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *UNRECOVERED_JUMPTABLE;
  ExtTask *pEVar1;
  Task *pTVar2;
  ExtTask *pEVar3;
  long in_FS_OFFSET;
  bool bVar4;
  ExtTask et;
  ExtTask local_40;
  
  self = *(WorkerP **)(in_FS_OFFSET + -8);
  if (self != (WorkerP *)0x0) {
    UNRECOVERED_JUMPTABLE = task->f;
    pTVar2 = lace_get_head(self);
    (*UNRECOVERED_JUMPTABLE)(self,pTVar2,task);
    return;
  }
  lace_resume();
  __sem = &local_40.sem;
  task->thief = (_Worker *)0x0;
  local_40.task = task;
  sem_init((sem_t *)__sem,0,0);
  pthread_mutex_lock((pthread_mutex_t *)&external_task_lock);
  if (external_task_exclusive == 1) {
    do {
      pthread_cond_wait((pthread_cond_t *)&external_task_cond,(pthread_mutex_t *)&external_task_lock
                       );
    } while (external_task_exclusive != 0);
  }
  external_task_counter = external_task_counter + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&external_task_lock);
  pEVar3 = (ExtTask *)0x0;
  do {
    LOCK();
    bVar4 = pEVar3 != external_task;
    pEVar1 = &local_40;
    if (bVar4) {
      pEVar3 = external_task;
      pEVar1 = external_task;
    }
    external_task = pEVar1;
    UNLOCK();
  } while (bVar4);
  sem_wait((sem_t *)__sem);
  sem_destroy((sem_t *)__sem);
  pthread_mutex_lock((pthread_mutex_t *)&external_task_lock);
  external_task_counter = external_task_counter + -1;
  if ((external_task_counter == 0 & external_task_exclusive) == 1) {
    pthread_cond_broadcast((pthread_cond_t *)&external_task_cond);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&external_task_lock);
  lace_suspend();
  return;
}

Assistant:

void
lace_run_task(Task *task)
{
    // check if we are really not in a Lace thread
    WorkerP* self = lace_get_worker();
    if (self != 0) {
        task->f(self, lace_get_head(self), task);
    } else {
        // if needed, wake up the workers
        lace_resume();

        ExtTask et;
        et.task = task;
        atomic_store_explicit(&et.task->thief, 0, memory_order_relaxed);
        sem_init(&et.sem, 0, 0);

        pthread_mutex_lock(&external_task_lock);
        while (external_task_exclusive) {
            // if "exclusive" is set, then we wait until we can continue
            pthread_cond_wait(&external_task_cond, &external_task_lock);
        }
        external_task_counter++;
        pthread_mutex_unlock(&external_task_lock);

        ExtTask *exp = 0;
        while (atomic_compare_exchange_weak(&external_task, &exp, &et) != 1) {}

        sem_wait(&et.sem);
        sem_destroy(&et.sem);

        pthread_mutex_lock(&external_task_lock);
        external_task_counter--;
        if (external_task_exclusive && external_task_counter == 0) {
            // if counter is 0 and exclusive is set, then we should wake up the threads
            pthread_cond_broadcast(&external_task_cond);
        }
        pthread_mutex_unlock(&external_task_lock);

        // allow Lace workers to sleep again
        lace_suspend();
    }
}